

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O3

int32 write_kd_trees(char *outfile,kd_tree_node_t **trees,uint32 n_trees)

{
  int32 iVar1;
  FILE *__s;
  ulong uVar2;
  
  __s = fopen(outfile,"w");
  if (__s == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                   ,0x16b,"Failed to open %s",outfile);
    iVar1 = -1;
  }
  else {
    fwrite("KD-TREES\n",9,1,__s);
    fprintf(__s,"version %d\n",1);
    fprintf(__s,"n_trees %d\n",(ulong)n_trees);
    if (n_trees != 0) {
      uVar2 = 0;
      do {
        fprintf(__s,"TREE %d\n",uVar2 & 0xffffffff);
        fprintf(__s,"n_density %d\n",(ulong)trees[uVar2]->n_density);
        fprintf(__s,"n_comp %d\n",(ulong)trees[uVar2]->n_comp);
        fprintf(__s,"n_level %d\n",(ulong)trees[uVar2]->n_level);
        fprintf(__s,"threshold %f\n",(double)(float)trees[uVar2]->threshold);
        write_kd_nodes((FILE *)__s,trees[uVar2],trees[uVar2]->n_level);
        fputc(10,__s);
        uVar2 = uVar2 + 1;
      } while (n_trees != uVar2);
    }
    fclose(__s);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int32
write_kd_trees(const char *outfile, kd_tree_node_t **trees, uint32 n_trees)
{
	FILE *fp;
	uint32 i;

	if ((fp = fopen(outfile, "w"))  == NULL) {
		E_ERROR_SYSTEM("Failed to open %s", outfile);
		return -1;
	}
	fprintf(fp, "KD-TREES\n");
	fprintf(fp, "version %d\n", KDTREE_VERSION);
	fprintf(fp, "n_trees %d\n", n_trees);
	for (i = 0; i < n_trees; ++i) {
		fprintf(fp, "TREE %d\n", i);
		fprintf(fp, "n_density %d\n", trees[i]->n_density);
		fprintf(fp, "n_comp %d\n", trees[i]->n_comp);
		fprintf(fp, "n_level %d\n", trees[i]->n_level);
		fprintf(fp, "threshold %f\n", trees[i]->threshold);
		/* Output the nodes in depth-first ordering */
		write_kd_nodes(fp, trees[i], trees[i]->n_level);
		fprintf(fp, "\n");
	}
	fclose(fp);
	return 0;
}